

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

void __thiscall
icu_63::DayPeriodRulesDataSink::put
          (DayPeriodRulesDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  undefined1 auVar1 [16];
  char *__s1;
  UBool UVar2;
  int iVar3;
  int32_t value_00;
  UMemory *this_00;
  DayPeriodRules *this_01;
  undefined7 in_register_00000009;
  char *size;
  int32_t i;
  long lVar4;
  char *key_local;
  int32_t local_dc;
  DayPeriodRules *local_d8;
  ulong local_d0;
  DayPeriodRulesDataSink *local_c8;
  ResourceTable locales;
  ResourceTable dayPeriodData;
  ResourceTable rules;
  
  key_local = key;
  local_c8 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&dayPeriodData,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i = 0;
    while (UVar2 = ResourceTable::getKeyAndValue(&dayPeriodData,i,&key_local,value),
          __s1 = key_local, UVar2 != '\0') {
      iVar3 = strcmp(key_local,"locales");
      if (iVar3 == 0) {
        (*(value->super_UObject)._vptr_UObject[0xb])(&locales,value,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return;
        }
        iVar3 = 0;
        while (UVar2 = ResourceTable::getKeyAndValue(&locales,iVar3,&key_local,value), UVar2 != '\0'
              ) {
          ResourceValue::getUnicodeString((UnicodeString *)&rules,value,errorCode);
          value_00 = parseSetNum((UnicodeString *)&rules,errorCode);
          uhash_puti_63((UHashtable *)*(anonymous_namespace)::data,key_local,value_00,errorCode);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&rules);
          iVar3 = iVar3 + 1;
        }
      }
      else {
        size = "rules";
        iVar3 = strcmp(__s1,"rules");
        if (iVar3 == 0) {
          iVar3 = *(int *)((anonymous_namespace)::data + 2);
          local_d0 = (ulong)(iVar3 + 1);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_d0;
          this_00 = SUB168(auVar1 * ZEXT816(100),0);
          if (SUB168(auVar1 * ZEXT816(100),8) != 0) {
            this_00 = (UMemory *)0xffffffffffffffff;
          }
          this_01 = (DayPeriodRules *)UMemory::operator_new__(this_00,(size_t)size);
          if (this_01 == (DayPeriodRules *)0x0) {
            (anonymous_namespace)::data[1] = 0;
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
            return;
          }
          local_dc = i;
          local_d8 = this_01;
          if (iVar3 + 1 != 0) {
            lVar4 = local_d0 * 100;
            do {
              DayPeriodRules::DayPeriodRules(this_01);
              this_01 = this_01 + 1;
              lVar4 = lVar4 + -100;
            } while (lVar4 != 0);
          }
          (anonymous_namespace)::data[1] = local_d8;
          (*(value->super_UObject)._vptr_UObject[0xb])((UnicodeString *)&rules,value,errorCode);
          processRules(local_c8,&rules,key_local,value,errorCode);
          i = local_dc;
          if (U_ZERO_ERROR < *errorCode) {
            return;
          }
        }
      }
      i = i + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool, UErrorCode &errorCode) {
        ResourceTable dayPeriodData = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }

        for (int32_t i = 0; dayPeriodData.getKeyAndValue(i, key, value); ++i) {
            if (uprv_strcmp(key, "locales") == 0) {
                ResourceTable locales = value.getTable(errorCode);
                if (U_FAILURE(errorCode)) { return; }

                for (int32_t j = 0; locales.getKeyAndValue(j, key, value); ++j) {
                    UnicodeString setNum_str = value.getUnicodeString(errorCode);
                    int32_t setNum = parseSetNum(setNum_str, errorCode);
                    uhash_puti(data->localeToRuleSetNumMap, const_cast<char *>(key), setNum, &errorCode);
                }
            } else if (uprv_strcmp(key, "rules") == 0) {
                // Allocate one more than needed to skip [0]. See comment in parseSetNum().
                data->rules = new DayPeriodRules[data->maxRuleSetNum + 1];
                if (data->rules == NULL) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                ResourceTable rules = value.getTable(errorCode);
                processRules(rules, key, value, errorCode);
                if (U_FAILURE(errorCode)) { return; }
            }
        }
    }